

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O2

void __thiscall enact::AstSerialise::visitForExpr_abi_cxx11_(AstSerialise *this)

{
  ForExpr *in_RDX;
  long in_RSI;
  
  visitForExpr_abi_cxx11_((string *)this,(AstSerialise *)(in_RSI + -8),in_RDX);
  return;
}

Assistant:

std::string AstSerialise::visitForExpr(ForExpr& expr) {
        std::stringstream s;

        s << m_ident << "(Expr::For (" << expr.name.lexeme << " " << visitExpr(*expr.object) << ")\n";
        m_ident += "    ";

        s << visitExpr(*expr.body);

        m_ident.erase(0, 4);
        s << m_ident << ")";

        return s.str();
    }